

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O1

ValidSchema __thiscall avro::compileJsonSchemaFromStream(avro *this,InputStream *is)

{
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar1;
  ValidSchema VVar2;
  NodePtr n;
  Entity e;
  SymbolTable st;
  NodePtr local_80;
  Entity local_70;
  string local_60;
  _Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
  local_40;
  
  json::loadEntity((json *)&local_70,is);
  local_40._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_40._M_impl.super__Rb_tree_header._M_header;
  local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40._M_impl.super__Rb_tree_header._M_header._M_right =
       local_40._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  makeNode((avro *)&local_80,&local_70,(SymbolTable *)&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  ValidSchema::ValidSchema((ValidSchema *)this,&local_80);
  boost::detail::shared_count::~shared_count(&local_80.pn);
  std::
  _Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
  ::~_Rb_tree(&local_40);
  sVar1.pi_ = extraout_RDX;
  if (local_70.value_.content != (placeholder *)0x0) {
    (*(local_70.value_.content)->_vptr_placeholder[1])();
    sVar1.pi_ = extraout_RDX_00;
  }
  VVar2.root_.pn.pi_ = sVar1.pi_;
  VVar2.root_.px = (element_type *)this;
  return (ValidSchema)VVar2.root_;
}

Assistant:

AVRO_DECL ValidSchema compileJsonSchemaFromStream(InputStream& is)
{
    json::Entity e = json::loadEntity(is);
    SymbolTable st;
    NodePtr n = makeNode(e, st, "");
    return ValidSchema(n);
}